

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_surf.cc
# Opt level: O3

void __thiscall hwtest::pgraph::anon_unknown_14::MthdClipSize::~MthdClipSize(MthdClipSize *this)

{
  pointer pcVar1;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test
       = (_func_int **)&PTR__SingleMthdTest_00356770;
  pcVar1 = (this->super_SingleMthdTest).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SingleMthdTest).name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		int vidx = chipset.card_type < 0x10 ? 13 : 9;
		exp.vtx_xy[vidx][0] = extr(val, 0, 16);
		exp.vtx_xy[vidx][1] = extr(val, 16, 16);
		int xcstat = nv04_pgraph_clip_status(&exp, exp.vtx_xy[vidx][0], 0);
		int ycstat = nv04_pgraph_clip_status(&exp, exp.vtx_xy[vidx][1], 1);
		pgraph_set_xy_d(&exp, 0, 1, 1, false, false, false, xcstat);
		pgraph_set_xy_d(&exp, 1, 1, 1, false, false, false, ycstat);
		exp.uclip_min[0][0] = 0;
		exp.uclip_min[0][1] = 0;
		exp.uclip_max[0][0] = exp.vtx_xy[vidx][0];
		exp.uclip_max[0][1] = exp.vtx_xy[vidx][1];
		insrt(exp.valid[0], 28, 1, 0);
		insrt(exp.valid[0], 30, 1, 0);
		insrt(exp.xy_misc_1[0], 4, 2, 0);
		insrt(exp.xy_misc_1[0], 12, 1, 0);
		insrt(exp.xy_misc_1[0], 16, 1, 0);
		insrt(exp.xy_misc_1[0], 20, 1, 0);
	}